

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O3

cse_abstract * __thiscall
factory_item<xray_re::se_stalker>::create(factory_item<xray_re::se_stalker> *this)

{
  se_stalker *this_00;
  
  this_00 = (se_stalker *)operator_new(0x390);
  xray_re::se_stalker::se_stalker(this_00);
  *(anon_union_8_3_e9edf90f_for_xr_clsid_0 *)
   &(this_00->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
    super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0xa0 =
       (this->super_factory_item_base).m_clsid.field_0;
  return (cse_abstract *)
         &(this_00->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
          super_cse_alife_monster_abstract;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}